

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpComms.cpp
# Opt level: O3

bool __thiscall
helics::tcp::TcpComms::establishBrokerConnection
          (TcpComms *this,shared_ptr<gmlc::networking::AsioContextManager> *ioctx,
          shared_ptr<gmlc::networking::TcpConnection> *brokerConnection)

{
  uint uVar1;
  _Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_> _Var2;
  TcpConnection *pTVar3;
  element_type *peVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  undefined4 uVar12;
  int iVar13;
  uint uVar14;
  void *__s;
  ulong extraout_RAX;
  int *piVar15;
  string *address;
  size_t __n;
  void *__buf;
  value_type *__val;
  shared_ptr<gmlc::networking::TcpConnection> *psVar16;
  ConnectionStatus status;
  ulong uVar17;
  SocketFactory *sf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  _Alloc_hider _Var19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var20;
  uint uVar22;
  uint uVar23;
  TcpComms *pTVar24;
  bool bVar25;
  string_view message;
  string_view string1;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view string2;
  anon_class_16_2_8f9776d2 terminate;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> brkprt;
  string __str;
  ActionMessage m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  TcpComms *local_2c0;
  shared_ptr<gmlc::networking::TcpConnection> *local_2b8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_2b0;
  element_type *local_288;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_280;
  string *local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  shared_ptr<gmlc::networking::AsioContextManager> *local_258;
  undefined1 local_250 [12];
  int iStack_244;
  undefined1 local_240 [176];
  char local_190;
  void *local_188;
  long lStack_180;
  long local_178;
  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *local_168;
  undefined1 local_160 [16];
  _Alloc_hider _Stack_150;
  size_type local_148;
  undefined8 local_118;
  _Alloc_hider local_110;
  undefined1 local_e8 [184];
  pointer pcVar21;
  
  uVar9 = (this->super_NetworkCommsInterface).brokerPort;
  local_2c0 = this;
  local_2b8 = brokerConnection;
  local_258 = ioctx;
  if ((int)uVar9 < 0) {
    uVar9 = getDefaultPort(6);
    (this->super_NetworkCommsInterface).brokerPort = uVar9;
  }
  if ((this->super_NetworkCommsInterface).encrypted == true) {
    gmlc::networking::SocketFactory::SocketFactory
              ((SocketFactory *)(local_160 + 8),&this->encryption_config,true);
    uVar9 = (this->super_NetworkCommsInterface).brokerPort;
  }
  else {
    local_160._8_8_ = 0;
    _Stack_150._M_p = (pointer)0x0;
    local_148 = 0;
  }
  uVar1 = -uVar9;
  if (0 < (int)uVar9) {
    uVar1 = uVar9;
  }
  uVar22 = 1;
  if (9 < uVar1) {
    uVar17 = (ulong)uVar1;
    uVar23 = 4;
    do {
      uVar22 = uVar23;
      uVar14 = (uint)uVar17;
      if (uVar14 < 100) {
        uVar22 = uVar22 - 2;
        goto LAB_002c898d;
      }
      if (uVar14 < 1000) {
        uVar22 = uVar22 - 1;
        goto LAB_002c898d;
      }
      if (uVar14 < 10000) goto LAB_002c898d;
      uVar17 = uVar17 / 10000;
      uVar23 = uVar22 + 4;
    } while (99999 < uVar14);
    uVar22 = uVar22 + 1;
  }
LAB_002c898d:
  _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
       (((local_258->
         super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr)->ictx)._M_t.
       super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
       super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
       super__Head_base<0UL,_asio::io_context_*,_false>;
  local_250._0_8_ = local_240;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
             (ulong)(uVar22 + -((int)uVar9 >> 0x1f)),'-');
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_250._0_8_ + (ulong)(uint)-((int)uVar9 >> 0x1f)),uVar22,uVar1);
  sf = (SocketFactory *)(local_160 + 8);
  gmlc::networking::establishConnection
            ((networking *)local_e8,sf,
             (io_context *)_Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
             &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress,
             (string *)local_250,
             (milliseconds)
             (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
  uVar8 = local_e8._8_8_;
  uVar7 = local_e8._0_8_;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var20 = (brokerConnection->
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi;
  (brokerConnection->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
  )._M_ptr = (element_type *)uVar7;
  (brokerConnection->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
  )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
  if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
  }
  if ((TcpComms *)local_250._0_8_ != (TcpComms *)local_240) {
    sf = (SocketFactory *)(local_240._0_8_ + 1);
    operator_delete((void *)local_250._0_8_,(ulong)sf);
  }
  iVar13 = (int)sf;
  if ((brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    local_268 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
    uVar9 = 0;
    do {
      psVar16 = local_2b8;
      pTVar24 = local_2c0;
      iVar13 = (int)sf;
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) != 0) {
        pTVar3 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar3 == (TcpConnection *)0x0) goto LAB_002c97a6;
        gmlc::networking::TcpConnection::close(pTVar3,iVar13);
        goto LAB_002c978b;
      }
      if (uVar9 == 0) {
        message._M_str = "initial connection to broker timed out ";
        message._M_len = 0x27;
        iVar13 = 0x27;
        CommsInterface::logWarning((CommsInterface *)this,message);
      }
      if ((this->super_NetworkCommsInterface).maxRetries <= (int)uVar9) {
        message_03._M_str =
             "initial connection to broker timed out exceeding max number of retries ";
        message_03._M_len = 0x47;
        iVar13 = 0x47;
        CommsInterface::logWarning((CommsInterface *)this,message_03);
        psVar16 = local_2b8;
        pTVar24 = local_2c0;
        pTVar3 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar3 == (TcpConnection *)0x0) {
          status = ERRORED;
          goto LAB_002c97ab;
        }
        gmlc::networking::TcpConnection::close(pTVar3,iVar13);
        p_Var20 = (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)0x0;
        (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        status = ERRORED;
        goto LAB_002c979a;
      }
      if ((uVar9 & 1) == 0) {
        sched_yield();
      }
      else {
        local_250._0_8_ = (TcpComms *)0x0;
        stack0xfffffffffffffdb8 = (void **)0x5f5e100;
        do {
          pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250;
          iVar10 = nanosleep((timespec *)local_250,(timespec *)local_250);
          iVar13 = (int)pbVar18;
          if (iVar10 != -1) break;
          piVar15 = __errno_location();
        } while (*piVar15 == 4);
      }
      psVar16 = local_2b8;
      pTVar24 = local_2c0;
      if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i &
          1U) != 0) {
        pTVar3 = (local_2b8->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        if (pTVar3 == (TcpConnection *)0x0) goto LAB_002c97a6;
        gmlc::networking::TcpConnection::close(pTVar3,iVar13);
        goto LAB_002c978b;
      }
      uVar1 = (this->super_NetworkCommsInterface).brokerPort;
      uVar22 = -uVar1;
      if (0 < (int)uVar1) {
        uVar22 = uVar1;
      }
      uVar23 = 1;
      if (9 < uVar22) {
        uVar17 = (ulong)uVar22;
        uVar14 = 4;
        do {
          uVar23 = uVar14;
          uVar11 = (uint)uVar17;
          if (uVar11 < 100) {
            uVar23 = uVar23 - 2;
            goto LAB_002c8b94;
          }
          if (uVar11 < 1000) {
            uVar23 = uVar23 - 1;
            goto LAB_002c8b94;
          }
          if (uVar11 < 10000) goto LAB_002c8b94;
          uVar17 = uVar17 / 10000;
          uVar14 = uVar23 + 4;
        } while (99999 < uVar11);
        uVar23 = uVar23 + 1;
      }
LAB_002c8b94:
      uVar9 = uVar9 + 1;
      _Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl =
           (((local_258->
             super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>).
            _M_ptr)->ictx)._M_t.
           super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>._M_t.
           super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>.
           super__Head_base<0UL,_asio::io_context_*,_false>;
      local_250._0_8_ = local_240;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 (ulong)(uVar23 + -((int)uVar1 >> 0x1f)),'-');
      std::__detail::__to_chars_10_impl<unsigned_int>
                ((char *)(local_250._0_8_ + (ulong)(uint)-((int)uVar1 >> 0x1f)),uVar23,uVar22);
      sf = (SocketFactory *)(local_160 + 8);
      gmlc::networking::establishConnection
                ((networking *)local_e8,sf,
                 (io_context *)_Var2.super__Head_base<0UL,_asio::io_context_*,_false>._M_head_impl,
                 local_268,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 (milliseconds)
                 (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r);
      uVar8 = local_e8._8_8_;
      uVar7 = local_e8._0_8_;
      local_e8._0_8_ = (element_type *)0x0;
      local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var20 = (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)uVar7;
      (brokerConnection->
      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar8;
      if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      }
      if ((TcpComms *)local_250._0_8_ != (TcpComms *)local_240) {
        sf = (SocketFactory *)(local_240._0_8_ + 1);
        operator_delete((void *)local_250._0_8_,(ulong)sf);
      }
      iVar13 = (int)sf;
    } while ((brokerConnection->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             == (element_type *)0x0);
  }
  psVar16 = local_2b8;
  pTVar24 = local_2c0;
  if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i & 1U)
      == 0) {
    uVar9 = (uint)(this->super_NetworkCommsInterface).noAckConnection;
    if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
      uVar9 = 0;
    }
    bVar25 = true;
    local_268 = (string *)CONCAT44(local_268._4_4_,uVar9);
    if ((uVar9 & 1) == 0) {
      local_110._M_p = (pointer)&(this->super_NetworkCommsInterface).super_CommsInterface.txQueue;
      local_260 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerTargetAddress;
      local_168 = (BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable> *)
                  &this->rxMessageQueue;
      local_160._0_8_ = 0;
      do {
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_protocol_priority);
        uVar12 = 0x12d;
        if ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1) {
          uVar12 = 0x5af;
        }
        local_e8._4_4_ = uVar12;
        pcVar21 = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
                  _M_dataplus._M_p;
        __n = (this->super_NetworkCommsInterface).super_CommsInterface.brokerInitString.
              _M_string_length;
        string1._M_str =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_dataplus._M_p;
        string1._M_len =
             (this->super_NetworkCommsInterface).super_CommsInterface.brokerName._M_string_length;
        string2._M_str = pcVar21;
        string2._M_len = __n;
        ActionMessage::setStringData((ActionMessage *)local_e8,string1,string2);
        iVar13 = (int)pcVar21;
        pTVar3 = (brokerConnection->
                 super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr;
        ActionMessage::packetize_abi_cxx11_((string *)local_250,(ActionMessage *)local_e8);
        gmlc::networking::TcpConnection::send(pTVar3,(int)(string *)local_250,__buf,__n,iVar13);
        if ((TcpComms *)local_250._0_8_ != (TcpComms *)local_240) {
          operator_delete((void *)local_250._0_8_,(ulong)(local_240._0_8_ + 1));
        }
        local_188 = (void *)0x0;
        lStack_180 = 0;
        local_178 = 0;
        __s = operator_new(0x200);
        local_188 = __s;
        local_178 = (long)__s + 0x200;
        memset(__s,0,0x200);
        peVar4 = (((brokerConnection->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->socket_).
                 super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        unique0x00005300 = &local_188;
        local_240._8_8_ =
             std::
             _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
             ::_M_invoke;
        local_240._0_8_ =
             std::
             _Function_handler<void_(const_std::error_code_&,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/network/tcp/TcpComms.cpp:311:33)>
             ::_M_manager;
        local_250._0_8_ = this;
        lStack_180 = (long)__s + 0x200;
        (*peVar4->_vptr_Socket[3])(peVar4,__s,0x80,(string *)local_250);
        if ((_func_int **)local_240._0_8_ != (_func_int **)0x0) {
          (*(code *)local_240._0_8_)((string *)local_250,(string *)local_250,3);
        }
        _Var19._M_p = local_110._M_p;
        gmlc::containers::
        BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
        ::pop<std::chrono::duration<long,std::ratio<1l,1000l>>>
                  ((optional<std::pair<helics::route_id,_helics::ActionMessage>_> *)local_250,
                   (BlockingPriorityQueue<std::pair<helics::route_id,helics::ActionMessage>,std::mutex,std::condition_variable>
                    *)local_110._M_p,(duration<long,_std::ratio<1L,_1000L>_>)0xc8);
        psVar16 = local_2b8;
        pTVar24 = local_2c0;
        if (local_190 == '\x01') {
          if (((local_250._8_4_ == -60000) || (local_250._8_4_ == 0x1000ea60)) ||
             (local_250._8_4_ == 60000)) {
            if ((iStack_244 == 0x5ab) &&
               ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i < 1)) {
              gmlc::containers::
              BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
              push<helics::ActionMessage&>(local_168,(ActionMessage *)(local_250 + 8));
              uVar17 = extraout_RAX;
            }
            else if ((iStack_244 != 0x130) ||
                    (uVar9 = (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>
                             ._M_i, uVar17 = (ulong)uVar9, (int)uVar9 < 1)) {
              if (iStack_244 == 0x14d) {
                message_02._M_str = "got new broker information";
                message_02._M_len = 0x1a;
                iVar13 = 0x1a;
                CommsInterface::logMessage((CommsInterface *)this,message_02);
                gmlc::networking::TcpConnection::close
                          ((brokerConnection->
                           super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr,iVar13);
                address = ActionMessage::getString_abi_cxx11_((ActionMessage *)(local_250 + 8),0);
                gmlc::networking::extractInterfaceAndPort(&local_2b0,address);
                (this->super_NetworkCommsInterface).brokerPort = local_2b0.second;
                iVar13 = std::__cxx11::
                         basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                                   (&local_2b0.first,"?");
                if (iVar13 != 0) {
                  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  _M_assign(local_260,&local_2b0.first);
                }
                uVar9 = (this->super_NetworkCommsInterface).brokerPort;
                uVar1 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar1 = uVar9;
                }
                uVar22 = 1;
                if (9 < uVar1) {
                  uVar17 = (ulong)uVar1;
                  uVar23 = 4;
                  do {
                    uVar22 = uVar23;
                    uVar14 = (uint)uVar17;
                    if (uVar14 < 100) {
                      uVar22 = uVar22 - 2;
                      goto LAB_002c93f0;
                    }
                    if (uVar14 < 1000) {
                      uVar22 = uVar22 - 1;
                      goto LAB_002c93f0;
                    }
                    if (uVar14 < 10000) goto LAB_002c93f0;
                    uVar17 = uVar17 / 10000;
                    uVar23 = uVar22 + 4;
                  } while (99999 < uVar14);
                  uVar22 = uVar22 + 1;
                }
LAB_002c93f0:
                local_118 = (((local_258->
                              super___shared_ptr<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2>
                              )._M_ptr)->ictx)._M_t.
                            super___uniq_ptr_impl<asio::io_context,_std::default_delete<asio::io_context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_asio::io_context_*,_std::default_delete<asio::io_context>_>
                            .super__Head_base<0UL,_asio::io_context_*,_false>;
                local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_construct(&local_2e0,(ulong)(uVar22 + -((int)uVar9 >> 0x1f)),'-');
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_2e0._M_dataplus._M_p + (uint)-((int)uVar9 >> 0x1f),uVar22,uVar1);
                gmlc::networking::establishConnection
                          ((networking *)&local_288,(SocketFactory *)(local_160 + 8),
                           (io_context *)local_118,local_260,&local_2e0,
                           (milliseconds)
                           (this->super_NetworkCommsInterface).super_CommsInterface.
                           connectionTimeout.__r);
                p_Var6 = p_Stack_280;
                peVar5 = local_288;
                local_288 = (element_type *)0x0;
                p_Stack_280 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var20 = (brokerConnection->
                          super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                          )._M_refcount._M_pi;
                (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr = peVar5;
                (brokerConnection->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi = p_Var6;
                if ((p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                   (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20),
                   p_Stack_280 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_280);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
                  operator_delete(local_2e0._M_dataplus._M_p,
                                  local_2e0.field_2._M_allocated_capacity + 1);
                }
                uVar9 = 4;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2b0.first._M_dataplus._M_p != &local_2b0.first.field_2) {
                  operator_delete(local_2b0.first._M_dataplus._M_p,
                                  local_2b0.first.field_2._M_allocated_capacity + 1);
                }
              }
              else if (iStack_244 == 0xed3) {
                local_2e0._M_dataplus._M_p = (pointer)0x2;
                local_2e0._M_string_length = 0;
                do {
                  iVar13 = nanosleep((timespec *)&local_2e0,(timespec *)&local_2e0);
                  if (iVar13 != -1) break;
                  piVar15 = __errno_location();
                } while (*piVar15 == 4);
                uVar9 = 4;
              }
              else {
                if (iStack_244 != 0x9db) {
                  gmlc::containers::
                  BlockingQueue<helics::ActionMessage,std::mutex,std::condition_variable>::
                  push<helics::ActionMessage&>(local_168,(ActionMessage *)(local_250 + 8));
                  goto LAB_002c9383;
                }
                pTVar3 = (local_2b8->
                         super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr;
                if (pTVar3 != (TcpConnection *)0x0) {
                  gmlc::networking::TcpConnection::close(pTVar3,(int)_Var19._M_p);
                  p_Var20 = (psVar16->
                            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount._M_pi;
                  (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr = (element_type *)0x0;
                  (psVar16->
                  super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
                  }
                }
                uVar9 = 1;
                CommsInterface::setTxStatus((CommsInterface *)pTVar24,TERMINATED);
              }
              goto LAB_002c9386;
            }
            uVar9 = 4;
            local_268 = (string *)CONCAT44(local_268._4_4_,(int)CONCAT71((int7)(uVar17 >> 8),1));
          }
          else {
            message_01._M_str = "unexpected message received in transmit queue";
            message_01._M_len = 0x2d;
            CommsInterface::logWarning((CommsInterface *)this,message_01);
LAB_002c9383:
            uVar9 = 0;
          }
        }
        else {
          local_160._0_8_ = local_160._0_8_ + 200;
          if ((long)local_160._0_8_ <
              (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r)
          goto LAB_002c9383;
          (*((((brokerConnection->
               super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->socket_).
             super___shared_ptr<gmlc::networking::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_Socket[0xb])();
          message_00._M_str = "port number query to broker timed out";
          message_00._M_len = 0x25;
          iVar13 = 0x25;
          CommsInterface::logError((CommsInterface *)this,message_00);
          psVar16 = local_2b8;
          pTVar24 = local_2c0;
          pTVar3 = (local_2b8->
                   super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (pTVar3 != (TcpConnection *)0x0) {
            gmlc::networking::TcpConnection::close(pTVar3,iVar13);
            p_Var20 = (psVar16->
                      super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount._M_pi;
            (psVar16->
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 = (element_type *)0x0;
            (psVar16->
            super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
            }
          }
          uVar9 = 1;
          CommsInterface::setTxStatus((CommsInterface *)pTVar24,ERRORED);
        }
LAB_002c9386:
        if (local_190 == '\x01') {
          local_190 = '\0';
          ActionMessage::~ActionMessage((ActionMessage *)(local_250 + 8));
        }
        if (local_188 != (void *)0x0) {
          operator_delete(local_188,local_178 - (long)local_188);
        }
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        if ((uVar9 & 3) != 0) goto LAB_002c970f;
      } while (((ulong)local_268 & 1) == 0);
      uVar9 = 0;
LAB_002c970f:
      bVar25 = uVar9 == 0;
    }
  }
  else {
    pTVar3 = (local_2b8->
             super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    if (pTVar3 == (TcpConnection *)0x0) {
LAB_002c97a6:
      status = TERMINATED;
      pTVar24 = local_2c0;
    }
    else {
      gmlc::networking::TcpConnection::close(pTVar3,iVar13);
LAB_002c978b:
      p_Var20 = (psVar16->
                super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)0x0;
      (psVar16->super___shared_ptr<gmlc::networking::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      status = TERMINATED;
LAB_002c979a:
      if (p_Var20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var20);
      }
    }
LAB_002c97ab:
    CommsInterface::setTxStatus((CommsInterface *)pTVar24,status);
    bVar25 = false;
  }
  if ((long *)_Stack_150._M_p != (long *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      piVar15 = (int *)(_Stack_150._M_p + 0xc);
      iVar13 = *piVar15;
      *piVar15 = *piVar15 + -1;
      UNLOCK();
    }
    else {
      iVar13 = *(int *)(_Stack_150._M_p + 0xc);
      *(int *)(_Stack_150._M_p + 0xc) = iVar13 + -1;
    }
    if (iVar13 == 1) {
      (**(code **)(*(long *)_Stack_150._M_p + 0x18))();
    }
  }
  return bVar25;
}

Assistant:

bool TcpComms::establishBrokerConnection(
    std::shared_ptr<gmlc::networking::AsioContextManager>& ioctx,
    std::shared_ptr<TcpConnection>& brokerConnection)
{
    // lambda function that does the proper termination
    auto terminate = [&, this](ConnectionStatus status) -> bool {
        if (brokerConnection) {
            brokerConnection->close();
            brokerConnection = nullptr;
        }
        setTxStatus(status);
        return false;
    };

    if (brokerPort < 0) {
        brokerPort = getDefaultBrokerPort();
    }
    try {
        auto sf = encrypted ? gmlc::networking::SocketFactory(encryption_config) :
                              gmlc::networking::SocketFactory();
        try {
            brokerConnection = gmlc::networking::establishConnection(sf,
                                                                     ioctx->getBaseContext(),
                                                                     brokerTargetAddress,
                                                                     std::to_string(brokerPort),
                                                                     connectionTimeout);
        }
        catch (std::system_error& e) {
            logWarning(std::string("network error (retrying):: ") + e.what());
            brokerConnection = nullptr;
        }
        int retries = 0;
        while (!brokerConnection) {
            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            if (retries == 0) {
                logWarning("initial connection to broker timed out ");
            }
            ++retries;
            if (retries > maxRetries) {
                logWarning(
                    "initial connection to broker timed out exceeding max number of retries ");
                return terminate(ConnectionStatus::ERRORED);
            }
            if (retries % 2 == 1) {
                std::this_thread::yield();
            } else {
                std::this_thread::sleep_for(std::chrono::milliseconds(100));
            }

            if (requestDisconnect.load(std::memory_order_acquire)) {
                return terminate(ConnectionStatus::TERMINATED);
            }
            try {
                brokerConnection = gmlc::networking::establishConnection(sf,
                                                                         ioctx->getBaseContext(),
                                                                         brokerTargetAddress,
                                                                         std::to_string(brokerPort),
                                                                         connectionTimeout);
            }
            catch (std::system_error& e) {
                logWarning(std::string("network error (retry #") + std::to_string(retries) +
                           "):: " + e.what());
                brokerConnection = nullptr;
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            return terminate(ConnectionStatus::TERMINATED);
        }
        // monitor the total waiting time before connections
        std::chrono::milliseconds cumulativeSleep{0};
        const std::chrono::milliseconds popTimeout{200};

        bool connectionEstablished{false};
        if (PortNumber > 0 && NetworkCommsInterface::noAckConnection) {
            connectionEstablished = true;
        }
        while (!connectionEstablished) {
            ActionMessage m(CMD_PROTOCOL_PRIORITY);
            m.messageID = (PortNumber <= 0) ? REQUEST_PORTS : CONNECTION_REQUEST;

            m.setStringData(brokerName, brokerInitString);
            try {
                brokerConnection->send(m.packetize());
            }
            catch (const std::system_error& error) {
                logError(std::string("error in initial send to broker ") + error.what());
                return terminate(ConnectionStatus::ERRORED);
            }
            std::vector<char> rx(512);
            tcp::endpoint brk;
            brokerConnection->async_receive(
                rx.data(), 128, [this, &rx](const std::error_code& error, size_t bytes) {
                    if (!error) {
                        txReceive(rx.data(), bytes, std::string());
                    } else {
                        if (error != asio::error::operation_aborted) {
                            txReceive(rx.data(), bytes, error.message());
                        }
                    }
                });
            auto mess = txQueue.pop(popTimeout);
            if (mess) {
                if (isProtocolCommand(mess->second)) {
                    if (mess->second.messageID == PORT_DEFINITIONS) {
                        if (PortNumber <= 0) {
                            rxMessageQueue.push(mess->second);
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == CONNECTION_ACK) {
                        if (PortNumber > 0) {
                            connectionEstablished = true;
                            continue;
                        }
                    }
                    if (mess->second.messageID == DISCONNECT) {
                        return terminate(ConnectionStatus::TERMINATED);
                    }
                    if (mess->second.messageID == NEW_BROKER_INFORMATION) {
                        logMessage("got new broker information");
                        brokerConnection->close();

                        auto brkprt =
                            gmlc::networking::extractInterfaceAndPort(mess->second.getString(0));
                        brokerPort = brkprt.second;
                        if (brkprt.first != "?") {
                            brokerTargetAddress = brkprt.first;
                        }
                        try {
                            brokerConnection =
                                gmlc::networking::establishConnection(sf,
                                                                      ioctx->getBaseContext(),
                                                                      brokerTargetAddress,
                                                                      std::to_string(brokerPort),
                                                                      connectionTimeout);
                        }
                        catch (const std::exception& e) {
                            brokerConnection = nullptr;
                            logError(std::string(" unable to create broker connection to ") +
                                     brokerTargetAddress + "::" + e.what());
                            return terminate(ConnectionStatus::ERRORED);
                        }
                        continue;
                    }
                    if (mess->second.messageID == DELAY_CONNECTION) {
                        std::this_thread::sleep_for(std::chrono::seconds(2));
                        continue;
                    }
                    rxMessageQueue.push(mess->second);
                } else {
                    logWarning("unexpected message received in transmit queue");
                }
            } else {
                cumulativeSleep += popTimeout;
                if (cumulativeSleep >= connectionTimeout) {
                    brokerConnection->cancel();
                    logError("port number query to broker timed out");
                    return terminate(ConnectionStatus::ERRORED);
                }
            }
        }
    }
    catch (std::exception& e) {
        logError(std::string("error connecting with Broker") + e.what());
        return terminate(ConnectionStatus::ERRORED);
    }
    return true;
}